

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderRectFilledRangeH
               (ImDrawList *draw_list,ImRect *rect,ImU32 col,float x_start_norm,float x_end_norm,
               float rounding)

{
  ImVec2 *pIVar1;
  ImVec2 *__dest;
  int iVar2;
  int iVar3;
  ImVec2 *pIVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 local_a0;
  float local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_5c;
  float local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if ((x_end_norm == x_start_norm) && (!NAN(x_end_norm) && !NAN(x_start_norm))) {
    return;
  }
  fVar7 = x_end_norm;
  if (x_start_norm <= x_end_norm) {
    fVar7 = x_start_norm;
    x_start_norm = x_end_norm;
  }
  fVar8 = (rect->Min).x;
  local_88 = (rect->Min).y;
  fVar15 = (rect->Max).x - fVar8;
  local_58 = fVar7 * fVar15 + fVar8;
  fVar14 = x_start_norm * fVar15 + fVar8;
  fVar7 = (rect->Max).y;
  fVar9 = 0.0;
  local_48.x = fVar14;
  local_48.y = fVar7;
  local_40.x = local_58;
  local_40.y = local_88;
  if ((rounding != 0.0) || (NAN(rounding))) {
    fVar13 = (fVar7 - local_88) * 0.5;
    fVar16 = fVar15 * 0.5;
    if (fVar13 <= fVar15 * 0.5) {
      fVar16 = fVar13;
    }
    fVar16 = fVar16 + -1.0;
    if (fVar16 <= rounding) {
      rounding = fVar16;
    }
    local_98 = (float)(~-(uint)(fVar16 < 0.0) & (uint)rounding);
    local_78 = 1.0 / local_98;
    fVar15 = 1.0 - (local_58 - fVar8) * local_78;
    if (fVar15 <= 0.0) {
      fVar9 = 1.5707964;
    }
    else if (fVar15 < 1.0) {
      fVar9 = acosf(fVar15);
      fVar8 = (rect->Min).x;
    }
    fVar15 = 1.0 - (fVar14 - fVar8) * local_78;
    fVar16 = 0.0;
    if (fVar15 <= 0.0) {
      fVar16 = 1.5707964;
    }
    else if (fVar15 < 1.0) {
      fVar16 = acosf(fVar15);
      fVar8 = (rect->Min).x;
    }
    uVar6 = -(uint)(fVar8 + local_98 <= local_58);
    local_38 = (float)(uVar6 & (uint)local_58 | ~uVar6 & (uint)(fVar8 + local_98));
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
    if ((fVar9 != fVar16) || (NAN(fVar9) || NAN(fVar16))) {
      local_a0.y = fVar7 - local_98;
      local_a0.x = local_38;
      if ((fVar9 != 0.0) || (((NAN(fVar9) || (fVar16 != 1.5707964)) || (NAN(fVar16))))) {
        local_5c = fVar16;
        ImDrawList::PathArcTo(draw_list,&local_a0,local_98,3.1415927 - fVar16,3.1415927 - fVar9,3);
        local_a0.y = local_88 + local_98;
        local_a0.x = local_38;
        ImDrawList::PathArcTo(draw_list,&local_a0,local_98,fVar9 + 3.1415927,local_5c + 3.1415927,3)
        ;
      }
      else {
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,3,6);
        local_a0.y = local_88 + local_98;
        local_a0.x = local_38;
        ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,6,9);
      }
    }
    else {
      iVar3 = (draw_list->_Path).Size;
      if (iVar3 == (draw_list->_Path).Capacity) {
        if (iVar3 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar3 / 2 + iVar3;
        }
        iVar5 = iVar3 + 1;
        if (iVar3 + 1 < iVar2) {
          iVar5 = iVar2;
        }
        pIVar1 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
        pIVar4 = (draw_list->_Path).Data;
        if (pIVar4 == (ImVec2 *)0x0) {
          pIVar4 = (ImVec2 *)0x0;
        }
        else {
          memcpy(pIVar1,pIVar4,(long)(draw_list->_Path).Size << 3);
          pIVar4 = (draw_list->_Path).Data;
        }
        MemFree(pIVar4);
        (draw_list->_Path).Data = pIVar1;
        (draw_list->_Path).Capacity = iVar5;
        iVar3 = (draw_list->_Path).Size;
      }
      else {
        pIVar1 = (draw_list->_Path).Data;
      }
      pIVar1[iVar3].x = local_38;
      pIVar1[iVar3].y = fVar7;
      iVar2 = (draw_list->_Path).Size;
      iVar3 = iVar2 + 1;
      (draw_list->_Path).Size = iVar3;
      if (iVar3 == (draw_list->_Path).Capacity) {
        iVar2 = iVar2 + 2;
        if (iVar3 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar3 / 2 + iVar3;
        }
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        pIVar1 = (ImVec2 *)MemAlloc((long)iVar2 << 3);
        pIVar4 = (draw_list->_Path).Data;
        if (pIVar4 == (ImVec2 *)0x0) {
          pIVar4 = (ImVec2 *)0x0;
        }
        else {
          memcpy(pIVar1,pIVar4,(long)(draw_list->_Path).Size << 3);
          pIVar4 = (draw_list->_Path).Data;
        }
        MemFree(pIVar4);
        (draw_list->_Path).Data = pIVar1;
        (draw_list->_Path).Capacity = iVar2;
        iVar3 = (draw_list->_Path).Size;
      }
      else {
        pIVar1 = (draw_list->_Path).Data;
      }
      pIVar1[iVar3].x = local_38;
      pIVar1[iVar3].y = local_88;
      (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    }
    if ((rect->Min).x + local_98 < fVar14) {
      fVar8 = (rect->Max).x;
      fVar9 = 1.0 - (fVar8 - fVar14) * local_78;
      if (fVar9 <= 0.0) {
        fVar15 = 1.5707964;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
      }
      else {
        fVar15 = 0.0;
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        if (fVar9 < 1.0) {
          fVar15 = acosf(fVar9);
          fVar8 = (rect->Max).x;
          uVar17 = extraout_XMM0_Db;
          uVar18 = extraout_XMM0_Dc;
          uVar19 = extraout_XMM0_Dd;
        }
      }
      uVar12 = 0;
      uVar11 = 0;
      uVar10 = 0;
      fVar9 = 1.5707964;
      fVar16 = 1.0 - (fVar8 - local_58) * local_78;
      if (0.0 < fVar16) {
        fVar9 = 0.0;
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        if (fVar16 < 1.0) {
          local_78 = fVar15;
          uStack_74 = uVar17;
          uStack_70 = uVar18;
          uStack_6c = uVar19;
          fVar9 = acosf(fVar16);
          fVar8 = (rect->Max).x;
          uVar10 = extraout_XMM0_Db_00;
          uVar11 = extraout_XMM0_Dc_00;
          uVar12 = extraout_XMM0_Dd_00;
          fVar15 = local_78;
          uVar17 = uStack_74;
          uVar18 = uStack_70;
          uVar19 = uStack_6c;
        }
      }
      if (fVar8 - local_98 <= fVar14) {
        fVar14 = fVar8 - local_98;
      }
      if ((fVar15 != fVar9) || (NAN(fVar15) || NAN(fVar9))) {
        local_a0.y = local_88 + local_98;
        local_a0.x = fVar14;
        if (((fVar15 != 0.0) || ((NAN(fVar15) || (fVar9 != 1.5707964)))) || (NAN(fVar9))) {
          local_88 = fVar9;
          uStack_84 = uVar10;
          uStack_80 = uVar11;
          uStack_7c = uVar12;
          local_78 = fVar15;
          uStack_74 = uVar17;
          uStack_70 = uVar18;
          uStack_6c = uVar19;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,-fVar9,-fVar15,3);
          local_a0.y = fVar7 - local_98;
          local_a0.x = fVar14;
          ImDrawList::PathArcTo(draw_list,&local_a0,local_98,local_78,local_88,3);
        }
        else {
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,9,0xc);
          local_a0.y = fVar7 - local_98;
          local_a0.x = fVar14;
          ImDrawList::PathArcToFast(draw_list,&local_a0,local_98,0,3);
        }
      }
      else {
        iVar3 = (draw_list->_Path).Size;
        if (iVar3 == (draw_list->_Path).Capacity) {
          if (iVar3 == 0) {
            iVar2 = 8;
          }
          else {
            iVar2 = iVar3 / 2 + iVar3;
          }
          iVar5 = iVar3 + 1;
          if (iVar3 + 1 < iVar2) {
            iVar5 = iVar2;
          }
          pIVar1 = (ImVec2 *)MemAlloc((long)iVar5 << 3);
          pIVar4 = (draw_list->_Path).Data;
          if (pIVar4 == (ImVec2 *)0x0) {
            pIVar4 = (ImVec2 *)0x0;
          }
          else {
            memcpy(pIVar1,pIVar4,(long)(draw_list->_Path).Size << 3);
            pIVar4 = (draw_list->_Path).Data;
          }
          MemFree(pIVar4);
          (draw_list->_Path).Data = pIVar1;
          (draw_list->_Path).Capacity = iVar5;
          iVar3 = (draw_list->_Path).Size;
        }
        else {
          pIVar1 = (draw_list->_Path).Data;
        }
        pIVar1[iVar3].x = fVar14;
        pIVar1[iVar3].y = local_88;
        iVar3 = (draw_list->_Path).Size;
        iVar2 = iVar3 + 1;
        (draw_list->_Path).Size = iVar2;
        if (iVar2 == (draw_list->_Path).Capacity) {
          iVar3 = iVar3 + 2;
          if (iVar2 == 0) {
            iVar2 = 8;
          }
          else {
            iVar2 = iVar2 / 2 + iVar2;
          }
          if (iVar3 < iVar2) {
            iVar3 = iVar2;
          }
          pIVar1 = (ImVec2 *)MemAlloc((long)iVar3 << 3);
          pIVar4 = (draw_list->_Path).Data;
          if (pIVar4 == (ImVec2 *)0x0) {
            pIVar4 = (ImVec2 *)0x0;
          }
          else {
            memcpy(pIVar1,pIVar4,(long)(draw_list->_Path).Size << 3);
            pIVar4 = (draw_list->_Path).Data;
          }
          MemFree(pIVar4);
          (draw_list->_Path).Data = pIVar1;
          (draw_list->_Path).Capacity = iVar3;
          iVar2 = (draw_list->_Path).Size;
        }
        else {
          pIVar1 = (draw_list->_Path).Data;
        }
        pIVar1[iVar2].x = fVar14;
        pIVar1[iVar2].y = fVar7;
        (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
      }
    }
    ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col);
    if ((draw_list->_Path).Capacity < 0) {
      pIVar4 = (ImVec2 *)0x0;
      __dest = (ImVec2 *)MemAlloc(0);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(__dest,pIVar1,(long)(draw_list->_Path).Size << 3);
        pIVar4 = (draw_list->_Path).Data;
      }
      MemFree(pIVar4);
      (draw_list->_Path).Data = __dest;
      (draw_list->_Path).Capacity = 0;
    }
    (draw_list->_Path).Size = 0;
  }
  else if (0xffffff < col) {
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_40,&local_48,col);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledRangeH(ImDrawList* draw_list, const ImRect& rect, ImU32 col, float x_start_norm, float x_end_norm, float rounding)
{
    if (x_end_norm == x_start_norm)
        return;
    if (x_start_norm > x_end_norm)
        ImSwap(x_start_norm, x_end_norm);

    ImVec2 p0 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_start_norm), rect.Min.y);
    ImVec2 p1 = ImVec2(ImLerp(rect.Min.x, rect.Max.x, x_end_norm), rect.Max.y);
    if (rounding == 0.0f)
    {
        draw_list->AddRectFilled(p0, p1, col, 0.0f);
        return;
    }

    rounding = ImClamp(ImMin((rect.Max.x - rect.Min.x) * 0.5f, (rect.Max.y - rect.Min.y) * 0.5f) - 1.0f, 0.0f, rounding);
    const float inv_rounding = 1.0f / rounding;
    const float arc0_b = ImAcos01(1.0f - (p0.x - rect.Min.x) * inv_rounding);
    const float arc0_e = ImAcos01(1.0f - (p1.x - rect.Min.x) * inv_rounding);
    const float x0 = ImMax(p0.x, rect.Min.x + rounding);
    if (arc0_b == arc0_e)
    {
        draw_list->PathLineTo(ImVec2(x0, p1.y));
        draw_list->PathLineTo(ImVec2(x0, p0.y));
    }
    else if (arc0_b == 0.0f && arc0_e == IM_PI*0.5f)
    {
        draw_list->PathArcToFast(ImVec2(x0, p1.y - rounding), rounding, 3, 6); // BL
        draw_list->PathArcToFast(ImVec2(x0, p0.y + rounding), rounding, 6, 9); // TR
    }
    else
    {
        draw_list->PathArcTo(ImVec2(x0, p1.y - rounding), rounding, IM_PI - arc0_e, IM_PI - arc0_b, 3); // BL
        draw_list->PathArcTo(ImVec2(x0, p0.y + rounding), rounding, IM_PI + arc0_b, IM_PI + arc0_e, 3); // TR
    }
    if (p1.x > rect.Min.x + rounding)
    {
        const float arc1_b = ImAcos01(1.0f - (rect.Max.x - p1.x) * inv_rounding);
        const float arc1_e = ImAcos01(1.0f - (rect.Max.x - p0.x) * inv_rounding);
        const float x1 = ImMin(p1.x, rect.Max.x - rounding);
        if (arc1_b == arc1_e)
        {
            draw_list->PathLineTo(ImVec2(x1, p0.y));
            draw_list->PathLineTo(ImVec2(x1, p1.y));
        }
        else if (arc1_b == 0.0f && arc1_e == IM_PI*0.5f)
        {
            draw_list->PathArcToFast(ImVec2(x1, p0.y + rounding), rounding, 9, 12); // TR
            draw_list->PathArcToFast(ImVec2(x1, p1.y - rounding), rounding, 0, 3);  // BR
        }
        else
        {
            draw_list->PathArcTo(ImVec2(x1, p0.y + rounding), rounding, -arc1_e, -arc1_b, 3); // TR
            draw_list->PathArcTo(ImVec2(x1, p1.y - rounding), rounding, +arc1_b, +arc1_e, 3); // BR
        }
    }
    draw_list->PathFillConvex(col);
}